

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Waving.h
# Opt level: O2

void __thiscall WavingSketch<8U,_1U,_4U>::Init(WavingSketch<8U,_1U,_4U> *this,Data<4U> *item)

{
  uint uVar1;
  bool is_empty;
  bool local_19;
  
  uVar1 = Data<4U>::Hash(item,this->seed_choice);
  local_19 = false;
  Bucket::Insert(this->buckets + (ulong)uVar1 % (ulong)this->BUCKET_NUM,item,this->seed_s,
                 this->seed_incast,&local_19);
  this->cnt = this->cnt + (uint)local_19;
  return;
}

Assistant:

void Init(const Data<DATA_LEN>& item) {
		uint32_t bucket_pos = item.Hash(seed_choice) % BUCKET_NUM;
		bool is_empty = 0;
		buckets[bucket_pos].Insert(item, seed_s, seed_incast, is_empty);
		cnt += is_empty;
	}